

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O1

int idle(mbedtls_net_context *fd,mbedtls_timing_delay_context *timer,int idle_reason)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t rw;
  
  if (idle_reason == -0x6880) {
    rw = 2;
    bVar1 = false;
  }
  else if (idle_reason == -0x6900) {
    rw = 1;
    bVar1 = false;
  }
  else {
    rw = 0;
    bVar1 = true;
  }
  do {
    do {
      if ((timer != (mbedtls_timing_delay_context *)0x0) &&
         (iVar2 = mbedtls_timing_get_delay(timer), iVar2 == 2)) {
        return 0;
      }
    } while (bVar1);
    uVar3 = mbedtls_net_poll(fd,rw,0);
    if ((int)uVar3 < 0) {
      return uVar3;
    }
  } while (uVar3 != rw);
  return 0;
}

Assistant:

int idle( mbedtls_net_context *fd,
          mbedtls_timing_delay_context *timer,
          int idle_reason )
#endif
{
    int ret;
    int poll_type = 0;

    if( idle_reason == MBEDTLS_ERR_SSL_WANT_WRITE )
        poll_type = MBEDTLS_NET_POLL_WRITE;
    else if( idle_reason == MBEDTLS_ERR_SSL_WANT_READ )
        poll_type = MBEDTLS_NET_POLL_READ;
#if !defined(MBEDTLS_TIMING_C)
    else
        return( 0 );
#endif

    while( 1 )
    {
        /* Check if timer has expired */
#if defined(MBEDTLS_TIMING_C)
        if( timer != NULL &&
            mbedtls_timing_get_delay( timer ) == 2 )
        {
            break;
        }
#endif /* MBEDTLS_TIMING_C */

        /* Check if underlying transport became available */
        if( poll_type != 0 )
        {
            ret = mbedtls_net_poll( fd, poll_type, 0 );
            if( ret < 0 )
                return( ret );
            if( ret == poll_type )
                break;
        }
    }

    return( 0 );
}